

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_A_WeaponOffset(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  uint uVar6;
  AActor *self;
  VMValue *pVVar7;
  char *__assertion;
  int iVar8;
  bool bVar9;
  bool bVar10;
  double wx;
  double wy;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00559e6d;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_00559cb4:
        self = (AActor *)0x0;
        pVVar7 = param;
        uVar6 = numparam;
      }
      else {
        pPVar5 = (self->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (self->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar9 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        bVar10 = pPVar5 == pPVar3;
        if (!bVar10 && !bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar10 || bVar9);
        uVar6 = (uint)bVar9;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00559e6d;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      iVar8 = 0;
      wx = 0.0;
      wy = 32.0;
      iVar4 = 0;
      if (numparam == 1) goto LAB_00559e3c;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00559e5d;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar6,ret);
              puVar2[1] = pPVar5;
            }
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar9) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar9 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00559e6d;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_00559e5d;
      }
      wx = 0.0;
      wy = 32.0;
      iVar4 = iVar8;
      if (numparam < 3) {
LAB_00559e3c:
        A_OverlayOffset(self,1,wx,wy,iVar4);
        return 0;
      }
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 == 0xff) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
        if (numparam != 3) {
          VVar1 = param[3].field_0.field_3.Type;
          if (VVar1 == '\x01') {
            wx = param[3].field_0.f;
          }
          else {
            wx = 0.0;
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x3f6,
                            "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
          }
          if (4 < (uint)numparam) {
            VVar1 = param[4].field_0.field_3.Type;
            if (VVar1 == '\x01') {
              wy = param[4].field_0.f;
            }
            else {
              if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_FLOAT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                              ,0x3f7,
                              "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
              wy = 32.0;
            }
            if (numparam != 5) {
              VVar1 = param[5].field_0.field_3.Type;
              if (VVar1 == '\0') {
                iVar4 = param[5].field_0.i;
              }
              else if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_INT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                              ,0x3f8,
                              "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
            }
          }
        }
        goto LAB_00559e3c;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00559e6d;
    }
    if (self == (AActor *)0x0) goto LAB_00559cb4;
  }
LAB_00559e5d:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00559e6d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x3f5,"int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WeaponOffset)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_FLOAT_OPT(wx) { wx = 0.; }
	PARAM_FLOAT_OPT(wy) { wy = 32.; }
	PARAM_INT_OPT(flags) { flags = 0; }
	A_OverlayOffset(self, PSP_WEAPON, wx, wy, flags);
	return 0;
}